

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::requantize_from_int32_to_int8
               (Mat *src,Mat *dst,Mat *scale_in_data,Mat *scale_out_data,Mat *bias_data,
               int activation_type,Mat *activation_params,Option *opt)

{
  Layer *pLVar1;
  size_t in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_R8;
  int in_R9D;
  undefined8 in_stack_00000010;
  Mat weights [3];
  ParamDict pd;
  Layer *requantize;
  int in_stack_fffffffffffffe3c;
  Mat *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  Mat *in_stack_fffffffffffffe58;
  ParamDict *in_stack_fffffffffffffe60;
  Mat *local_188;
  Mat *local_158;
  undefined1 local_148 [16];
  Mat local_138 [3];
  undefined1 auStack_60 [40];
  Layer *local_38;
  int local_2c;
  long local_28;
  size_t local_20;
  long local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_38 = create_layer(in_stack_fffffffffffffe4c);
  ParamDict::ParamDict(in_stack_fffffffffffffe60);
  ParamDict::set((ParamDict *)(auStack_60 + 0x18),0,*(int *)(local_18 + 0x2c));
  ParamDict::set((ParamDict *)(auStack_60 + 0x18),1,*(int *)(local_20 + 0x2c));
  ParamDict::set((ParamDict *)(auStack_60 + 0x18),2,*(int *)(local_28 + 0x2c));
  ParamDict::set((ParamDict *)(auStack_60 + 0x18),3,local_2c);
  ParamDict::set((ParamDict *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,(Mat *)0x146cc7);
  (*local_38->_vptr_Layer[2])(local_38,auStack_60 + 0x18);
  local_158 = local_138;
  do {
    Mat::Mat(local_158);
    local_158 = local_158 + 1;
  } while (local_158 != (Mat *)auStack_60);
  Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                 in_stack_fffffffffffffe40);
  Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                 in_stack_fffffffffffffe40);
  Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                 in_stack_fffffffffffffe40);
  pLVar1 = local_38;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  (*pLVar1->_vptr_Layer[3])(pLVar1,local_148);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffffe40);
  (*local_38->_vptr_Layer[4])(local_38,in_stack_00000010);
  (*local_38->_vptr_Layer[7])(local_38,local_8,local_10,in_stack_00000010);
  (*local_38->_vptr_Layer[5])(local_38,in_stack_00000010);
  if (local_38 != (Layer *)0x0) {
    (*local_38->_vptr_Layer[1])();
  }
  local_188 = (Mat *)auStack_60;
  do {
    local_188 = local_188 + -1;
    Mat::~Mat((Mat *)0x146e66);
  } while (local_188 != local_138);
  ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffffe40);
  return;
}

Assistant:

void requantize_from_int32_to_int8(const Mat& src, Mat& dst, const Mat& scale_in_data, const Mat& scale_out_data, const Mat& bias_data, int activation_type, const Mat& activation_params, const Option& opt)
{
    Layer* requantize = create_layer(LayerType::Requantize);

    ParamDict pd;
    pd.set(0, scale_in_data.w);
    pd.set(1, scale_out_data.w);
    pd.set(2, bias_data.w);
    pd.set(3, activation_type);
    pd.set(4, activation_params);

    requantize->load_param(pd);

    Mat weights[3];
    weights[0] = scale_in_data;
    weights[1] = scale_out_data;
    weights[2] = bias_data;

    requantize->load_model(ModelBinFromMatArray(weights));

    requantize->create_pipeline(opt);

    requantize->forward(src, dst, opt);

    requantize->destroy_pipeline(opt);

    delete requantize;
}